

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

OmegaOP * __thiscall
pybind11::detail::
argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
::
call_impl<OmegaOP*,OmegaOP*(*&)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),0ul,1ul,2ul,3ul,4ul,5ul,pybind11::detail::void_type>
          (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string>
           *this,void_type *f,undefined8 param_3)

{
  double dVar1;
  double dVar2;
  code *pcVar3;
  __tuple_element_t<0UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<vector<double>_>::type> pvVar4;
  __tuple_element_t<1UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_00;
  __tuple_element_t<2UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_01;
  template_cast_op_type<typename_std::add_rvalue_reference<double>::type> pdVar5;
  __tuple_element_t<3UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_02;
  template_cast_op_type<typename_std::add_rvalue_reference<basic_string<char>_>::type> pbVar6;
  __tuple_element_t<4UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_03;
  __tuple_element_t<5UL,_tuple<type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<vector<double,_allocator<double>_>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>,_type_caster<double,_void>,_type_caster<basic_string<char>,_void>_>_>
  *caster_04;
  OmegaOP *pOVar7;
  string local_a8 [32];
  string local_88 [48];
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  undefined8 local_28;
  void_type *param_3_local;
  _func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  **f_local;
  argument_loader<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pcVar3 = *(code **)f;
  local_28 = param_3;
  param_3_local = f;
  f_local = (_func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             **)this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                     ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                       *)this);
  pvVar4 = cast_op<std::vector<double,std::allocator<double>>>(caster);
  std::vector<double,_std::allocator<double>_>::vector(&local_40,pvVar4);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pvVar4 = cast_op<std::vector<double,std::allocator<double>>>(caster_00);
  std::vector<double,_std::allocator<double>_>::vector(&local_58,pvVar4);
  caster_01 = std::
              get<2ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pdVar5 = cast_op<double>(caster_01);
  dVar1 = *pdVar5;
  caster_02 = std::
              get<3ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pbVar6 = cast_op<std::__cxx11::string>(caster_02);
  std::__cxx11::string::string(local_88,(string *)pbVar6);
  caster_03 = std::
              get<4ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pdVar5 = cast_op<double>(caster_03);
  dVar2 = *pdVar5;
  caster_04 = std::
              get<5ul,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<std::vector<double,std::allocator<double>>,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>,pybind11::detail::type_caster<double,void>,pybind11::detail::type_caster<std::__cxx11::string,void>>
                        ((tuple<pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<std::vector<double,_std::allocator<double>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_pybind11::detail::type_caster<double,_void>,_pybind11::detail::type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                          *)this);
  pbVar6 = cast_op<std::__cxx11::string>(caster_04);
  std::__cxx11::string::string(local_a8,(string *)pbVar6);
  pOVar7 = (OmegaOP *)(*pcVar3)(dVar1,dVar2,&local_40,&local_58,local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::vector<double,_std::allocator<double>_>::~vector(&local_58);
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  return pOVar7;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }